

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fancy_tools.cxx
# Opt level: O3

void __thiscall fancy_tools::process(fancy_tools *this,cl_parser *cl)

{
  bool bVar1;
  int iVar2;
  xr_ini_file *this_00;
  char *pcVar3;
  size_t lindex;
  char *level;
  char *profile;
  string path;
  char *fancy_config;
  allocator<char> local_89;
  char *local_88;
  long *local_80 [2];
  long local_70 [2];
  char *local_60;
  string local_58;
  char *local_38;
  
  local_58._M_dataplus._M_p._0_1_ = 1;
  tools_base::check_path(&this->super_tools_base,"$game_levels$",(bool *)&local_58);
  if (((char)local_58._M_dataplus._M_p == '\x01') &&
     (bVar1 = cl_parser::get_string(cl,"-fancy",&local_38), bVar1)) {
    this_00 = (xr_ini_file *)operator_new(0x18);
    (this_00->m_sections).
    super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->m_sections).
    super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->m_sections).
    super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    xray_re::xr_ini_file::load(this_00,local_38);
    this->m_ini = this_00;
    if ((this_00->m_sections).
        super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_00->m_sections).
        super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      xray_re::msg("can\'t load %s",local_38);
    }
    else {
      if ((xray_re::xr_file_system::instance()::instance0 == '\0') &&
         (iVar2 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0), iVar2 != 0))
      {
        xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
        __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                     &xray_re::xr_file_system::instance::instance0,&__dso_handle);
        __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"gamedata.fancy\\","");
      bVar1 = cl_parser::get_string(cl,"-dir",&local_58);
      if (bVar1) {
        xray_re::xr_file_system::append_path_separator(&local_58);
      }
      std::__cxx11::string::append((char *)&local_58);
      bVar1 = xray_re::xr_file_system::create_path
                        (&xray_re::xr_file_system::instance::instance0,local_58._M_dataplus._M_p);
      if (bVar1) {
        lindex = 0;
        while (bVar1 = xray_re::xr_ini_file::r_line(this->m_ini,"levels",lindex,&local_88,&local_60)
              , bVar1) {
          bVar1 = xray_re::xr_file_system::folder_exist
                            (&xray_re::xr_file_system::instance::instance0,"$game_levels$",local_88)
          ;
          if (bVar1) {
            local_80[0] = local_70;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_80,local_58._M_dataplus._M_p,
                       local_58._M_dataplus._M_p + local_58._M_string_length);
            std::__cxx11::string::append((char *)local_80);
            bVar1 = xray_re::xr_file_system::create_folder
                              (&xray_re::xr_file_system::instance::instance0,(char *)local_80[0]);
            if (local_80[0] != local_70) {
              operator_delete(local_80[0],local_70[0] + 1);
            }
            if (!bVar1) {
              pcVar3 = "can\'t create output folder for %s";
              goto LAB_001229b9;
            }
            xray_re::xr_file_system::update_path
                      (&xray_re::xr_file_system::instance::instance0,"$level$","$game_levels$",
                       local_88);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_80,local_88,&local_89);
            xray_re::xr_file_system::update_path
                      (&xray_re::xr_file_system::instance::instance0,"$fancy_level$",
                       local_58._M_dataplus._M_p,(char *)local_80[0]);
            if (local_80[0] != local_70) {
              operator_delete(local_80[0],local_70[0] + 1);
            }
            xray_re::msg("processing %s",local_88);
            bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,local_60,"fix_details");
            if (bVar1) {
              pcVar3 = xray_re::xr_ini_file::r_string(this->m_ini,local_60,"fix_details");
              fix_details(this,pcVar3);
            }
            bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,local_60,"fix_fences");
            if (bVar1) {
              pcVar3 = xray_re::xr_ini_file::r_string(this->m_ini,local_60,"fix_fences");
              fix_fences(this,pcVar3);
            }
          }
          else {
            pcVar3 = "can\'t find level %s";
LAB_001229b9:
            xray_re::msg(pcVar3,local_88);
          }
          lindex = lindex + 1;
        }
      }
      else {
        xray_re::msg("can\'t create output folder %s",local_58._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void fancy_tools::process(const cl_parser& cl)
{
	if (!check_paths())
		return;

	const char* fancy_config;
	if (!cl.get_string("-fancy", fancy_config))
		return;
	m_ini = new xr_ini_file(fancy_config);
	if (m_ini->empty()) {
		msg("can't load %s", fancy_config);
		return;
	}

	xr_file_system& fs = xr_file_system::instance();

	std::string path("gamedata.fancy\\");
	if (cl.get_string("-dir", path))
		fs.append_path_separator(path);
	path.append("levels\\");
	if (!fs.create_path(path)) {
		msg("can't create output folder %s", path.c_str());
		return;
	}

	const char* level;
	const char* profile;
	for (size_t i = 0; m_ini->r_line("levels", i, &level, &profile); ++i) {
		if (!fs.folder_exist(PA_GAME_LEVELS, level)) {
			msg("can't find level %s", level);
			continue;
		}
		if (!fs.create_folder(path + level)) {
			msg("can't create output folder for %s", level);
			continue;
		}
		fs.update_path(PA_LEVEL, PA_GAME_LEVELS, level);
		fs.update_path(PA_FANCY_LEVEL, path, level);
		msg("processing %s", level);
		if (m_ini->line_exist(profile, "fix_details"))
			fix_details(m_ini->r_string(profile, "fix_details"));
		if (m_ini->line_exist(profile, "fix_fences"))
			fix_fences(m_ini->r_string(profile, "fix_fences"));
	}
}